

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

size_t tinyexr::miniz::mz_zip_heap_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar1 = *(long *)((long)pOpaque + 0x58);
  uVar5 = *(ulong *)(lVar1 + 0x70);
  if (*(ulong *)(lVar1 + 0x70) < n + file_ofs) {
    uVar5 = n + file_ofs;
  }
  if (n == 0) {
LAB_0012316b:
    n = 0;
  }
  else {
    uVar4 = *(ulong *)(lVar1 + 0x78);
    if (uVar4 < uVar5) {
      uVar2 = 0x40;
      if (0x40 < uVar4) {
        uVar2 = uVar4;
      }
      do {
        uVar4 = uVar2;
        uVar2 = uVar4 * 2;
      } while (uVar4 < uVar5);
      lVar3 = (**(code **)((long)pOpaque + 0x30))
                        (*(undefined8 *)((long)pOpaque + 0x38),*(undefined8 *)(lVar1 + 0x68),1,uVar4
                        );
      if (lVar3 == 0) goto LAB_0012316b;
      *(long *)(lVar1 + 0x68) = lVar3;
      *(ulong *)(lVar1 + 0x78) = uVar4;
    }
    else {
      lVar3 = *(long *)(lVar1 + 0x68);
    }
    memcpy((void *)(lVar3 + file_ofs),pBuf,n);
    *(ulong *)(lVar1 + 0x70) = uVar5;
  }
  return n;
}

Assistant:

static size_t mz_zip_heap_write_func(void *pOpaque, mz_uint64 file_ofs,
                                     const void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint64 new_size = MZ_MAX(file_ofs + n, pState->m_mem_size);
#ifdef _MSC_VER
  if ((!n) ||
      ((0, sizeof(size_t) == sizeof(mz_uint32)) && (new_size > 0x7FFFFFFF)))
#else
  if ((!n) ||
      ((sizeof(size_t) == sizeof(mz_uint32)) && (new_size > 0x7FFFFFFF)))
#endif
    return 0;
  if (new_size > pState->m_mem_capacity) {
    void *pNew_block;
    size_t new_capacity = MZ_MAX(64, pState->m_mem_capacity);
    while (new_capacity < new_size) new_capacity *= 2;
    if (NULL == (pNew_block = pZip->m_pRealloc(
                     pZip->m_pAlloc_opaque, pState->m_pMem, 1, new_capacity)))
      return 0;
    pState->m_pMem = pNew_block;
    pState->m_mem_capacity = new_capacity;
  }
  memcpy((mz_uint8 *)pState->m_pMem + file_ofs, pBuf, n);
  pState->m_mem_size = (size_t)new_size;
  return n;
}